

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

void pierce_outer_wall(chunk *c,loc_conflict grid)

{
  loc *plVar1;
  dun_data *pdVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  loc grid_00;
  
  pdVar2 = dun;
  wVar7 = dun->wall_n;
  wVar6 = grid.y;
  wVar5 = grid.x;
  if (wVar7 < (int)(uint)z_info->wall_pierce_max) {
    plVar1 = dun->wall;
    plVar1[wVar7].x = wVar5;
    plVar1[wVar7].y = wVar6;
    pdVar2->wall_n = pdVar2->wall_n + L'\x01';
  }
  for (wVar7 = wVar6 + L'\xffffffff'; wVar4 = wVar5 + L'\xffffffff', wVar7 <= wVar6 + L'\x01';
      wVar7 = wVar7 + L'\x01') {
    for (; wVar4 <= wVar5 + L'\x01'; wVar4 = wVar4 + L'\x01') {
      if (wVar4 != L'\0' && wVar7 != L'\0') {
        grid_00.y = wVar7;
        grid_00.x = wVar4;
        _Var3 = square_in_bounds((chunk_conflict *)c,grid_00);
        if ((_Var3) && (_Var3 = square_is_granite_with_flag(c,(loc_conflict)grid_00,L'\f'), _Var3))
        {
          set_marked_granite(c,(loc_conflict)grid_00,L'\r');
        }
      }
    }
  }
  return;
}

Assistant:

static void pierce_outer_wall(struct chunk *c, struct loc grid)
{
	struct loc adj;

	/* Save the wall location */
	if (dun->wall_n < z_info->wall_pierce_max) {
		dun->wall[dun->wall_n] = grid;
		dun->wall_n++;
	}

	/* Forbid re-entry near this piercing */
	for (adj.y = grid.y - 1; adj.y <= grid.y + 1; adj.y++) {
		for (adj.x = grid.x - 1; adj.x <= grid.x + 1; adj.x++) {
			if (adj.x != 0 && adj.y != 0 &&
					square_in_bounds(c, adj) &&
					square_is_granite_with_flag(c, adj,
					SQUARE_WALL_OUTER)) {
				set_marked_granite(c, adj, SQUARE_WALL_SOLID);
			}
		}
	}
}